

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# action.hpp
# Opt level: O2

bool __thiscall
boost::spirit::karma::
action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_short>>,0l>>>,2l>>>
::
generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,boost::spirit::unused_type>
          (action<boost::spirit::karma::any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::assign,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::argument<0>>,0l>,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::reference_wrapper<unsigned_short>>,0l>>>,2l>>>
           *this,output_iterator<std::back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_mpl_::int_<15>,_boost::spirit::unused_type>
                 *sink,unused_type *ctx,unused_type *d,unused_type *attr_)

{
  bool bVar1;
  unsigned_short local_2;
  
  bVar1 = any_binary_generator<boost::spirit::karma::detail::integer<16>,(boost::spirit::endian::endianness)0,16>
          ::
          generate<boost::spirit::karma::detail::output_iterator<std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,mpl_::int_<15>,boost::spirit::unused_type>,boost::spirit::unused_type_const,boost::spirit::unused_type,unsigned_short>
                    (sink,ctx,d,&local_2);
  return bVar1;
}

Assistant:

bool generate(OutputIterator& sink, Context& ctx, Delimiter const& d
          , Attribute const& attr_) const
        {
            typedef typename attribute<Context, unused_type>::type attr_type;
            typedef traits::make_attribute<attr_type, Attribute> make_attribute;

            // create a attribute if none is supplied
            // this creates a _copy_ of the attribute because the semantic
            // action will likely change parts of this
            typedef traits::transform_attribute<
                typename make_attribute::type, attr_type, domain> transform;

            typename transform::type attr = 
                traits::pre_transform<domain, attr_type>(make_attribute::call(attr_));

            // call the function, passing the attribute, the context and a bool 
            // flag that the client can set to false to fail generating.
            return traits::action_dispatch<Subject>()(f, attr, ctx) && 
                   subject.generate(sink, ctx, d, attr);
        }